

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

int * __thiscall Image::histogram(Image *this)

{
  int **ppiVar1;
  int *piVar2;
  int i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int j;
  ulong uVar7;
  
  piVar2 = (int *)operator_new__(0x400);
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    piVar2[lVar3] = 0;
  }
  uVar6 = 0;
  uVar5 = (ulong)(uint)this->col;
  if (this->col < 1) {
    uVar5 = uVar6;
  }
  ppiVar1 = this->matrix;
  uVar4 = (ulong)(uint)this->row;
  if (this->row < 1) {
    uVar4 = uVar6;
  }
  for (; uVar6 != uVar4; uVar6 = uVar6 + 1) {
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      piVar2[ppiVar1[uVar6][uVar7]] = piVar2[ppiVar1[uVar6][uVar7]] + 1;
    }
  }
  return piVar2;
}

Assistant:

int *Image::histogram()
{
    auto h = new int[256];

    for(int i=0; i<=255; ++i)
        h[i] = 0;
    for (int i = 0; i < row; ++i) {
        for (int j = 0; j < col; ++j) {
            h[matrix[i][j]]++;
        }
    }
    return h;
}